

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

boolean passes_bars(permonst *mptr)

{
  byte bVar1;
  uint uVar2;
  boolean bVar3;
  bool bVar4;
  
  uVar2 = mptr->mflags1;
  bVar4 = true;
  if ((((uVar2 & 0xc) == 0) && (mptr != mons + 0x9f && mptr->mlet != '\x16')) &&
     (bVar1 = mptr->msize, bVar1 != 0)) {
    bVar3 = dmgtype(mptr,5);
    if (bVar3 == '\0') {
      if ((uVar2 >> 0x13 & 1) == 0) {
        bVar4 = false;
      }
      else {
        bVar4 = bVar1 < 3;
      }
    }
  }
  return bVar4;
}

Assistant:

boolean passes_bars(const struct permonst *mptr)
{
    return (boolean) (passes_walls(mptr) || amorphous(mptr) ||
		      is_whirly(mptr) || verysmall(mptr) ||
		      dmgtype(mptr, AD_DISN) ||
		      (slithy(mptr) && !bigmonst(mptr)));
}